

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HTMLparser.c
# Opt level: O0

void htmlParsePI(htmlParserCtxtPtr ctxt)

{
  xmlParserInputState xVar1;
  int iVar2;
  xmlChar *str1;
  void *pvVar3;
  uint local_48;
  uint local_44;
  xmlChar *tmp;
  int count;
  xmlParserInputState state;
  xmlChar *target;
  int l;
  int cur;
  int size;
  int len;
  xmlChar *buf;
  htmlParserCtxtPtr ctxt_local;
  
  _size = (void *)0x0;
  cur = 0;
  l = 100;
  tmp._0_4_ = 0;
  if (ctxt->token == 0) {
    local_44 = (uint)*ctxt->input->cur;
  }
  else {
    local_44 = 0xffffffff;
  }
  if (local_44 != 0x3c) {
    return;
  }
  if (ctxt->input->cur[1] != '?') {
    return;
  }
  xVar1 = ctxt->instate;
  ctxt->instate = XML_PARSER_PI;
  ctxt->input->cur = ctxt->input->cur + 2;
  ctxt->input->col = ctxt->input->col + 2;
  buf = (xmlChar *)ctxt;
  if ((500 < (long)ctxt->input->cur - (long)ctxt->input->base) &&
     ((long)ctxt->input->end - (long)ctxt->input->cur < 500)) {
    xmlParserInputShrink(ctxt->input);
  }
  str1 = htmlParseName((htmlParserCtxtPtr)buf);
  if (str1 == (xmlChar *)0x0) {
    htmlParseErr((xmlParserCtxtPtr)buf,XML_ERR_PI_NOT_STARTED,"PI is not started correctly",
                 (xmlChar *)0x0,(xmlChar *)0x0);
  }
  else {
    if (*(int *)(buf + 0x114) == 0) {
      local_48 = (uint)**(byte **)(*(long *)(buf + 0x38) + 0x20);
    }
    else {
      local_48 = 0xffffffff;
    }
    if (local_48 == 0x3e) {
      *(long *)(*(long *)(buf + 0x38) + 0x20) = *(long *)(*(long *)(buf + 0x38) + 0x20) + 1;
      *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 1;
      if (((*(long *)buf != 0) && (*(int *)(buf + 0x14c) == 0)) &&
         (*(long *)(*(long *)buf + 0x98) != 0)) {
        (**(code **)(*(long *)buf + 0x98))(*(undefined8 *)(buf + 8),str1,0);
      }
      *(xmlParserInputState *)(buf + 0x110) = xVar1;
      return;
    }
    _size = (*xmlMallocAtomic)((long)l);
    if (_size == (void *)0x0) {
      htmlErrMemory((xmlParserCtxtPtr)buf,(char *)0x0);
      *(xmlParserInputState *)(buf + 0x110) = xVar1;
      return;
    }
    target._4_4_ = (uint)**(byte **)(*(long *)(buf + 0x38) + 0x20);
    if ((0xff < target._4_4_) ||
       (((target._4_4_ != 0x20 && ((target._4_4_ < 9 || (10 < target._4_4_)))) &&
        (target._4_4_ != 0xd)))) {
      htmlParseErr((xmlParserCtxtPtr)buf,XML_ERR_SPACE_REQUIRED,"ParsePI: PI %s space expected\n",
                   str1,(xmlChar *)0x0);
    }
    htmlSkipBlankChars((xmlParserCtxtPtr)buf);
    target._4_4_ = htmlCurrentChar((xmlParserCtxtPtr)buf,(int *)&target);
    while (target._4_4_ != 0 && target._4_4_ != 0x3e) {
      pvVar3 = _size;
      if (l <= cur + 5) {
        l = l << 1;
        pvVar3 = (*xmlRealloc)(_size,(long)l);
        if (pvVar3 == (void *)0x0) {
          htmlErrMemory((xmlParserCtxtPtr)buf,(char *)0x0);
          (*xmlFree)(_size);
          *(xmlParserInputState *)(buf + 0x110) = xVar1;
          return;
        }
      }
      _size = pvVar3;
      tmp._0_4_ = (int)tmp + 1;
      if (0x32 < (int)tmp) {
        if ((*(int *)(buf + 0x1c4) == 0) &&
           (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20) < 0xfa
           )) {
          xmlParserInputGrow(*(xmlParserInputPtr *)(buf + 0x38),0xfa);
        }
        tmp._0_4_ = 0;
      }
      if ((int)target._4_4_ < 0x100) {
        if ((((int)target._4_4_ < 9) || (10 < (int)target._4_4_)) &&
           ((target._4_4_ != 0xd && ((int)target._4_4_ < 0x20)))) goto LAB_0015de42;
LAB_0015de02:
        if ((int)target == 1) {
          *(char *)((long)_size + (long)cur) = (char)target._4_4_;
          cur = cur + 1;
        }
        else {
          iVar2 = xmlCopyChar((int)target,(xmlChar *)((long)_size + (long)cur),target._4_4_);
          cur = iVar2 + cur;
        }
      }
      else {
        if ((((0xff < (int)target._4_4_) && ((int)target._4_4_ < 0xd800)) ||
            ((0xdfff < (int)target._4_4_ && ((int)target._4_4_ < 0xfffe)))) ||
           ((0xffff < (int)target._4_4_ && ((int)target._4_4_ < 0x110000)))) goto LAB_0015de02;
LAB_0015de42:
        htmlParseErrInt((xmlParserCtxtPtr)buf,XML_ERR_INVALID_CHAR,
                        "Invalid char in processing instruction 0x%X\n",target._4_4_);
      }
      if (**(char **)(*(long *)(buf + 0x38) + 0x20) == '\n') {
        *(int *)(*(long *)(buf + 0x38) + 0x34) = *(int *)(*(long *)(buf + 0x38) + 0x34) + 1;
        *(undefined4 *)(*(long *)(buf + 0x38) + 0x38) = 1;
      }
      else {
        *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 1;
      }
      buf[0x114] = '\0';
      buf[0x115] = '\0';
      buf[0x116] = '\0';
      buf[0x117] = '\0';
      *(long *)(*(long *)(buf + 0x38) + 0x20) =
           *(long *)(*(long *)(buf + 0x38) + 0x20) + (long)(int)target;
      target._4_4_ = htmlCurrentChar((xmlParserCtxtPtr)buf,(int *)&target);
      if (target._4_4_ == 0) {
        if ((500 < *(long *)(*(long *)(buf + 0x38) + 0x20) - *(long *)(*(long *)(buf + 0x38) + 0x18)
            ) && (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20)
                  < 500)) {
          xmlParserInputShrink(*(xmlParserInputPtr *)(buf + 0x38));
        }
        if ((*(int *)(buf + 0x1c4) == 0) &&
           (*(long *)(*(long *)(buf + 0x38) + 0x28) - *(long *)(*(long *)(buf + 0x38) + 0x20) < 0xfa
           )) {
          xmlParserInputGrow(*(xmlParserInputPtr *)(buf + 0x38),0xfa);
        }
        target._4_4_ = htmlCurrentChar((xmlParserCtxtPtr)buf,(int *)&target);
      }
    }
    *(undefined1 *)((long)_size + (long)cur) = 0;
    if (target._4_4_ == 0x3e) {
      *(long *)(*(long *)(buf + 0x38) + 0x20) = *(long *)(*(long *)(buf + 0x38) + 0x20) + 1;
      *(int *)(*(long *)(buf + 0x38) + 0x38) = *(int *)(*(long *)(buf + 0x38) + 0x38) + 1;
      if (((*(long *)buf != 0) && (*(int *)(buf + 0x14c) == 0)) &&
         (*(long *)(*(long *)buf + 0x98) != 0)) {
        (**(code **)(*(long *)buf + 0x98))(*(undefined8 *)(buf + 8),str1,_size);
      }
    }
    else {
      htmlParseErr((xmlParserCtxtPtr)buf,XML_ERR_PI_NOT_FINISHED,"ParsePI: PI %s never end ...\n",
                   str1,(xmlChar *)0x0);
    }
    (*xmlFree)(_size);
  }
  *(xmlParserInputState *)(buf + 0x110) = xVar1;
  return;
}

Assistant:

static void
htmlParsePI(htmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = HTML_PARSER_BUFFER_SIZE;
    int cur, l;
    const xmlChar *target;
    xmlParserInputState state;
    int count = 0;

    if ((RAW == '<') && (NXT(1) == '?')) {
	state = ctxt->instate;
        ctxt->instate = XML_PARSER_PI;
	/*
	 * this is a Processing Instruction.
	 */
	SKIP(2);
	SHRINK;

	/*
	 * Parse the target name and check for special support like
	 * namespace.
	 */
        target = htmlParseName(ctxt);
	if (target != NULL) {
	    if (RAW == '>') {
		SKIP(1);

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, NULL);
		ctxt->instate = state;
		return;
	    }
	    buf = (xmlChar *) xmlMallocAtomic(size * sizeof(xmlChar));
	    if (buf == NULL) {
		htmlErrMemory(ctxt, NULL);
		ctxt->instate = state;
		return;
	    }
	    cur = CUR;
	    if (!IS_BLANK(cur)) {
		htmlParseErr(ctxt, XML_ERR_SPACE_REQUIRED,
			  "ParsePI: PI %s space expected\n", target, NULL);
	    }
            SKIP_BLANKS;
	    cur = CUR_CHAR(l);
	    while ((cur != 0) && (cur != '>')) {
		if (len + 5 >= size) {
		    xmlChar *tmp;

		    size *= 2;
		    tmp = (xmlChar *) xmlRealloc(buf, size * sizeof(xmlChar));
		    if (tmp == NULL) {
			htmlErrMemory(ctxt, NULL);
			xmlFree(buf);
			ctxt->instate = state;
			return;
		    }
		    buf = tmp;
		}
		count++;
		if (count > 50) {
		    GROW;
		    count = 0;
		}
                if (IS_CHAR(cur)) {
		    COPY_BUF(l,buf,len,cur);
                } else {
                    htmlParseErrInt(ctxt, XML_ERR_INVALID_CHAR,
                                    "Invalid char in processing instruction "
                                    "0x%X\n", cur);
                }
		NEXTL(l);
		cur = CUR_CHAR(l);
		if (cur == 0) {
		    SHRINK;
		    GROW;
		    cur = CUR_CHAR(l);
		}
	    }
	    buf[len] = 0;
	    if (cur != '>') {
		htmlParseErr(ctxt, XML_ERR_PI_NOT_FINISHED,
		      "ParsePI: PI %s never end ...\n", target, NULL);
	    } else {
		SKIP(1);

		/*
		 * SAX: PI detected.
		 */
		if ((ctxt->sax) && (!ctxt->disableSAX) &&
		    (ctxt->sax->processingInstruction != NULL))
		    ctxt->sax->processingInstruction(ctxt->userData,
		                                     target, buf);
	    }
	    xmlFree(buf);
	} else {
	    htmlParseErr(ctxt, XML_ERR_PI_NOT_STARTED,
                         "PI is not started correctly", NULL, NULL);
	}
	ctxt->instate = state;
    }
}